

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 jsonHexToInt4(char *z)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 uVar4;
  undefined1 auVar5 [16];
  
  auVar5 = ZEXT216(CONCAT11((-((z[1] & 0x40U) == 0x40) & 9U) + z[1],
                            (-((*z & 0x40U) == 0x40) & 9U) + *z)) & _DAT_0020b3f0;
  auVar3._10_6_ = 0;
  auVar3._0_10_ = SUB1610(ZEXT116(0) << 0x40,6);
  auVar2._11_5_ = 0;
  auVar2._0_11_ = SUB1611(auVar3 << 0x30,5);
  uVar4 = auVar5[1];
  auVar1._2_12_ = SUB1612(auVar2 << 0x28,4);
  auVar1[1] = uVar4;
  auVar1[0] = uVar4;
  uVar4 = auVar5[0];
  return (uint)(((char)(z[3] * '\x02') >> 7 & 9U) + z[3] & 0xf) |
         (uint)(byte)((((char)(z[2] * '\x02') >> 7 & 9U) + z[2]) * '\x10') |
         (uint)(ushort)(auVar1._0_2_ * 0x100 | CONCAT11(uVar4,uVar4) * 0x1000);
}

Assistant:

static u32 jsonHexToInt4(const char *z){
  u32 v;
  v = (jsonHexToInt(z[0])<<12)
    + (jsonHexToInt(z[1])<<8)
    + (jsonHexToInt(z[2])<<4)
    + jsonHexToInt(z[3]);
  return v;
}